

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_import.c
# Opt level: O1

REF_STATUS ref_import_meshb(REF_GRID_conflict *ref_grid_ptr,REF_MPI ref_mpi,char *filename)

{
  REF_GRID_conflict pRVar1;
  REF_NODE ref_node;
  REF_GEOM pRVar2;
  bool bVar3;
  REF_INT RVar4;
  uint uVar5;
  REF_STATUS RVar6;
  uint uVar7;
  int iVar8;
  FILE *__stream;
  size_t sVar9;
  long lVar10;
  ulong uVar11;
  REF_BYTE *__ptr;
  size_t sVar12;
  undefined8 uVar13;
  ulong uVar14;
  char *pcVar15;
  REF_INT *value;
  long lVar16;
  uint type;
  uint node;
  REF_LONG ref_private_status_reis_ai;
  REF_DBL *__ptr_00;
  REF_BOOL available;
  REF_INT new_node;
  REF_FILEPOS next_position;
  REF_INT version;
  REF_INT id;
  REF_INT new_geom;
  REF_INT ngeom;
  REF_INT ncell;
  REF_INT nnode;
  REF_INT keyword_code;
  REF_INT dim;
  double double_gref;
  REF_INT new_cell;
  REF_DBL param [2];
  REF_FILEPOS key_pos [156];
  uint local_620;
  int local_61c;
  ulong local_618;
  int local_60c;
  ulong local_608;
  REF_CELL local_600;
  ulong local_5f8;
  REF_INT local_5ec;
  REF_GEOM local_5e8;
  int local_5e0;
  REF_INT local_5dc;
  ulong local_5d8;
  int local_5cc;
  int local_5c8;
  int local_5c4;
  int local_5c0;
  int local_5bc;
  REF_INT local_5b8;
  uint local_5b4;
  long local_5b0;
  double local_5a8;
  REF_INT local_59c;
  REF_DBL local_598 [2];
  REF_INT local_588;
  undefined8 local_584;
  undefined8 local_57c;
  REF_FILEPOS local_518 [157];
  
  uVar5 = ref_import_meshb_header(filename,&local_5ec,local_518);
  if (uVar5 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",0x613,
           "ref_import_meshb",(ulong)uVar5,"header");
    return uVar5;
  }
  uVar5 = ref_grid_create(ref_grid_ptr,ref_mpi);
  if (uVar5 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",0x616,
           "ref_import_meshb",(ulong)uVar5,"create grid");
    return uVar5;
  }
  pRVar1 = *ref_grid_ptr;
  ref_node = pRVar1->node;
  pRVar2 = pRVar1->geom;
  __stream = fopen(filename,"r");
  RVar4 = local_5ec;
  if (__stream == (FILE *)0x0) {
    printf("unable to open %s\n",filename);
    pcVar15 = "unable to open file";
    uVar13 = 0x61e;
LAB_001f37bd:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",uVar13
           ,"ref_import_meshb",pcVar15);
    RVar6 = 2;
  }
  else {
    local_5e8 = pRVar2;
    uVar5 = ref_import_meshb_jump
                      ((FILE *)__stream,local_5ec,local_518,3,&local_61c,(REF_FILEPOS *)&local_5f8);
    if (uVar5 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
             0x622,"ref_import_meshb",(ulong)uVar5,"jump");
      return uVar5;
    }
    if (local_61c == 0) {
      pcVar15 = "meshb missing dimension";
      uVar13 = 0x623;
    }
    else {
      sVar9 = fread(&local_5b4,4,1,__stream);
      if (sVar9 != 1) {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
               0x624,"ref_import_meshb","dim",1,sVar9);
        return 1;
      }
      if (local_5b4 - 4 < 0xfffffffe) {
        printf("dim %d not supported\n");
        pcVar15 = "dim";
        uVar13 = 0x628;
      }
      else {
        if (local_5b4 == 2) {
          pRVar1->twod = 1;
        }
        local_618 = (ulong)local_5b4;
        uVar5 = ref_import_meshb_jump
                          ((FILE *)__stream,RVar4,local_518,4,&local_61c,(REF_FILEPOS *)&local_5f8);
        if (uVar5 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
                 0x62e,"ref_import_meshb",(ulong)uVar5,"jump");
          return uVar5;
        }
        if (local_61c != 0) {
          uVar5 = ref_import_meshb_int((FILE *)__stream,RVar4,&local_5bc);
          if (uVar5 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                   ,0x630,"ref_import_meshb",(ulong)uVar5,"nnode");
            return uVar5;
          }
          local_600 = (REF_CELL)(long)local_5bc;
          uVar14 = 0;
          if (0 < (long)local_600) {
            do {
              local_608 = uVar14;
              uVar5 = ref_node_add(ref_node,uVar14,&local_60c);
              if (uVar5 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                       ,0x634,"ref_import_meshb",(ulong)uVar5,"add node");
                return uVar5;
              }
              if ((int)local_618 == 2) {
                RVar6 = meshb_real((FILE *)__stream,RVar4,ref_node->real + (long)local_60c * 0xf);
                if (RVar6 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                         ,0x637,"ref_import_meshb",1,"x");
                  return 1;
                }
                RVar6 = meshb_real((FILE *)__stream,RVar4,ref_node->real + (long)local_60c * 0xf + 1
                                  );
                if (RVar6 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                         ,0x639,"ref_import_meshb",1,"y");
                  return 1;
                }
                ref_node->real[(long)local_60c * 0xf + 2] = 0.0;
              }
              else {
                uVar5 = meshb_real((FILE *)__stream,RVar4,ref_node->real + (long)local_60c * 0xf);
                if (uVar5 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                         ,0x63d,"ref_import_meshb",(ulong)uVar5,"x");
                  return uVar5;
                }
                RVar6 = meshb_real((FILE *)__stream,RVar4,ref_node->real + (long)local_60c * 0xf + 1
                                  );
                if (RVar6 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                         ,0x63f,"ref_import_meshb",1,"y");
                  return 1;
                }
                RVar6 = meshb_real((FILE *)__stream,RVar4,ref_node->real + (long)local_60c * 0xf + 2
                                  );
                if (RVar6 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                         ,0x641,"ref_import_meshb",1,"z");
                  return 1;
                }
              }
              RVar6 = ref_import_meshb_int((FILE *)__stream,RVar4,&local_5dc);
              if (RVar6 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                       ,0x643,"ref_import_meshb",1,"nnode");
                return 1;
              }
              uVar14 = local_608 + 1;
            } while (local_600 != (REF_CELL)uVar14);
          }
          uVar11 = local_5f8;
          local_620 = (uint)uVar14;
          uVar14 = ftello(__stream);
          if (uVar11 != uVar14) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                   ,0x645,"ref_import_meshb","end location",uVar11,uVar14);
            return 1;
          }
          uVar5 = ref_node_initialize_n_global(ref_node,(REF_GLOB)local_600);
          if (uVar5 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                   ,0x647,"ref_import_meshb",(ulong)uVar5,"init glob");
            return uVar5;
          }
          uVar14 = (ulong)local_620;
          lVar10 = 0;
          uVar5 = 0;
          do {
            local_600 = pRVar1->cell[lVar10];
            local_5b0 = lVar10;
            uVar7 = ref_cell_meshb_keyword(local_600,&local_5b8);
            if (uVar7 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                     ,0x64a,"ref_import_meshb",(ulong)uVar7,"kw");
              return uVar7;
            }
            uVar7 = ref_import_meshb_jump
                              ((FILE *)__stream,RVar4,local_518,local_5b8,&local_61c,
                               (REF_FILEPOS *)&local_5f8);
            if (uVar7 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                     ,0x64d,"ref_import_meshb",(ulong)uVar7,"jump");
              return uVar7;
            }
            if (local_61c != 0) {
              local_5d8 = (ulong)(uint)local_600->node_per;
              RVar6 = ref_import_meshb_int((FILE *)__stream,RVar4,&local_5c0);
              if (RVar6 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                       ,0x650,"ref_import_meshb",1,"ncell");
                return 1;
              }
              local_5cc = local_5c0;
              if (0 < local_5c0) {
                local_608 = (ulong)((int)local_5d8 + 1);
                local_5e0 = 0;
                do {
                  if (-1 < (int)local_5d8) {
                    value = &local_588;
                    uVar14 = 0;
                    do {
                      RVar6 = ref_import_meshb_int((FILE *)__stream,RVar4,value);
                      if (RVar6 != 0) {
                        uVar5 = 1;
                        local_618 = CONCAT44(local_618._4_4_,RVar6);
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                               ,0x654,"ref_import_meshb",1,"c2n");
                        RVar6 = (int)local_618;
                      }
                      if (RVar6 != 0) {
                        return uVar5;
                      }
                      uVar14 = uVar14 + 1;
                      value = value + 1;
                    } while (local_608 != uVar14);
                  }
                  if ((int)local_5d8 < 1) {
                    uVar14 = 0;
                  }
                  else {
                    uVar14 = 0;
                    do {
                      (&local_588)[uVar14] = (&local_588)[uVar14] + -1;
                      uVar14 = uVar14 + 1;
                    } while (local_5d8 != uVar14);
                  }
                  uVar13 = local_57c;
                  if (local_600->type == REF_CELL_PYR) {
                    local_57c = local_584;
                    local_584 = uVar13;
                  }
                  uVar7 = ref_cell_add(local_600,&local_588,&local_59c);
                  if (uVar7 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                           ,0x667,"ref_import_meshb",(ulong)uVar7,"add cell");
                    return uVar7;
                  }
                  local_5e0 = local_5e0 + 1;
                } while (local_5e0 != local_5cc);
              }
              uVar11 = local_5f8;
              local_608 = ftell(__stream);
              local_618 = uVar11;
              if (uVar11 != local_608) {
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                       ,0x669,"ref_import_meshb","cell inconsistent",uVar11,local_608);
                uVar5 = 1;
              }
              if (local_618 != local_608) {
                return uVar5;
              }
            }
            lVar10 = local_5b0 + 1;
          } while (lVar10 != 0x10);
          local_620 = (uint)uVar14;
          local_618 = CONCAT44(local_618._4_4_,local_5ec);
          lVar10 = 0;
          do {
            type = (uint)lVar10;
            uVar7 = ref_import_meshb_jump
                              ((FILE *)__stream,(int)local_618,local_518,type | 0x28,&local_61c,
                               (REF_FILEPOS *)&local_5f8);
            if (uVar7 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                     ,0x671,"ref_import_meshb",(ulong)uVar7,"jump");
              return uVar7;
            }
            if (local_61c != 0) {
              RVar6 = ref_import_meshb_int((FILE *)__stream,(int)local_618,&local_5c4);
              if (RVar6 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                       ,0x673,"ref_import_meshb",1,"ngeom");
                return 1;
              }
              local_600 = (REF_CELL)CONCAT44(local_600._4_4_,local_5c4);
              if (0 < local_5c4) {
                local_608 = local_608 & 0xffffffff00000000;
                do {
                  RVar6 = ref_import_meshb_int
                                    ((FILE *)__stream,(int)local_618,(REF_INT *)&local_620);
                  if (RVar6 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                           ,0x677,"ref_import_meshb",1,"node");
                    return 1;
                  }
                  RVar6 = ref_import_meshb_int((FILE *)__stream,(int)local_618,&local_5dc);
                  if (RVar6 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                           ,0x678,"ref_import_meshb",1,"node");
                    return 1;
                  }
                  if (lVar10 != 0) {
                    __ptr_00 = local_598;
                    lVar16 = lVar10;
                    do {
                      sVar9 = fread(__ptr_00,8,1,__stream);
                      if (sVar9 != 1) {
                        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                               ,0x67a,"ref_import_meshb","param",1,sVar9);
                        return 1;
                      }
                      __ptr_00 = __ptr_00 + 1;
                      lVar16 = lVar16 + -1;
                    } while (lVar16 != 0);
                  }
                  RVar4 = local_5dc;
                  node = local_620 - 1;
                  local_620 = node;
                  uVar7 = ref_geom_add(local_5e8,node,type,local_5dc,local_598);
                  if (uVar7 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                           ,0x67c,"ref_import_meshb",(ulong)uVar7,"add geom");
                    return uVar7;
                  }
                  if (lVar10 != 0) {
                    sVar9 = fread(&local_5a8,8,1,__stream);
                    if (sVar9 == 1) {
                      uVar7 = ref_geom_find(local_5e8,node,type,RVar4,&local_5c8);
                      if (uVar7 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                               ,0x681,"ref_import_meshb",(ulong)uVar7,"find");
                        uVar5 = uVar7;
                        goto LAB_001f4272;
                      }
                      local_5e8->descr[(long)local_5c8 * 6 + 2] = (int)local_5a8;
                      bVar3 = true;
                    }
                    else {
                      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                             ,0x680,"ref_import_meshb","gref",1,sVar9);
                      uVar5 = 1;
LAB_001f4272:
                      bVar3 = false;
                    }
                    if (!bVar3) {
                      return uVar5;
                    }
                  }
                  iVar8 = (int)local_608 + 1;
                  local_608 = CONCAT44(local_608._4_4_,iVar8);
                } while (iVar8 != (int)local_600);
              }
              uVar14 = local_5f8;
              uVar11 = ftello(__stream);
              if (uVar14 != uVar11) {
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                       ,0x685,"ref_import_meshb","end location",uVar14,uVar11);
                return 1;
              }
            }
            lVar10 = lVar10 + 1;
          } while (lVar10 != 3);
          uVar5 = ref_import_meshb_jump
                            ((FILE *)__stream,local_5ec,local_518,0x7e,&local_61c,
                             (REF_FILEPOS *)&local_5f8);
          if (uVar5 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                   ,0x68c,"ref_import_meshb",(ulong)uVar5,"jump");
            return uVar5;
          }
          if (local_61c == 0) {
LAB_001f44bd:
            fclose(__stream);
            return 0;
          }
          uVar5 = ref_import_meshb_size((FILE *)__stream,local_5ec,&local_5e8->cad_data_size);
          if (uVar5 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                   ,0x690,"ref_import_meshb",(ulong)uVar5,"cad data size");
            return uVar5;
          }
          if (local_5e8->cad_data != (REF_BYTE *)0x0) {
            free(local_5e8->cad_data);
          }
          pRVar2 = local_5e8;
          sVar9 = local_5e8->cad_data_size;
          __ptr = (REF_BYTE *)malloc(sVar9);
          pRVar2->cad_data = __ptr;
          if (__ptr != (REF_BYTE *)0x0) {
            sVar12 = fread(__ptr,1,sVar9,__stream);
            if (sVar9 != sVar12) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                     ,0x69a,"ref_import_meshb","cad_data",sVar9,sVar12);
              return 1;
            }
            uVar14 = ftello(__stream);
            if (local_5f8 != uVar14) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                     ,0x69b,"ref_import_meshb","end location",local_5f8,uVar14);
              return 1;
            }
            goto LAB_001f44bd;
          }
          pcVar15 = "malloc ref_geom_cad_data(ref_geom) of REF_BYTE NULL";
          uVar13 = 0x696;
          goto LAB_001f37bd;
        }
        pcVar15 = "meshb missing vertex";
        uVar13 = 0x62f;
      }
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",uVar13
           ,"ref_import_meshb",pcVar15);
    RVar6 = 1;
  }
  return RVar6;
}

Assistant:

REF_FCN static REF_STATUS ref_import_meshb(REF_GRID *ref_grid_ptr,
                                           REF_MPI ref_mpi,
                                           const char *filename) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_GEOM ref_geom;
  FILE *file;
  REF_INT version, dim;
  REF_BOOL available;
  REF_FILEPOS next_position;
  REF_FILEPOS key_pos[REF_IMPORT_MESHB_LAST_KEYWORD];
  REF_INT keyword_code, nnode, node, new_node;
  REF_INT ncell, cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER + 1]; /* everyone gets id in meshb */
  REF_INT new_cell;
  REF_INT n0, n1, n2, n3, n4, id, group, node_per;
  REF_INT geom_keyword, type, i, geom, ngeom;
  REF_DBL param[2];
  REF_INT cad_data_keyword;
  REF_BOOL verbose = REF_FALSE;

  if (verbose) printf("header %s\n", filename);
  RSS(ref_import_meshb_header(filename, &version, key_pos), "header");
  if (verbose) printf("meshb version %d\n", version);

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create grid");
  ref_grid = (*ref_grid_ptr);
  ref_node = ref_grid_node(ref_grid);
  ref_geom = ref_grid_geom(ref_grid);

  if (verbose) printf("open %s\n", filename);
  file = fopen(filename, "r");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  RSS(ref_import_meshb_jump(file, version, key_pos, 3, &available,
                            &next_position),
      "jump");
  RAS(available, "meshb missing dimension");
  REIS(1, fread((unsigned char *)&dim, 4, 1, file), "dim");
  if (verbose) printf("meshb dim %d\n", dim);
  if (dim < 2 || 3 < dim) {
    printf("dim %d not supported\n", dim);
    THROW("dim");
  }
  if (2 == dim) ref_grid_twod(ref_grid) = REF_TRUE;

  RSS(ref_import_meshb_jump(file, version, key_pos, 4, &available,
                            &next_position),
      "jump");
  RAS(available, "meshb missing vertex");
  RSS(ref_import_meshb_int(file, version, &nnode), "nnode");
  if (verbose) printf("nnode %d\n", nnode);

  for (node = 0; node < nnode; node++) {
    RSS(ref_node_add(ref_node, node, &new_node), "add node");
    if (2 == dim) {
      RSS(meshb_real(file, version, &(ref_node_xyz(ref_node, 0, new_node))),
          "x");
      RSS(meshb_real(file, version, &(ref_node_xyz(ref_node, 1, new_node))),
          "y");
      ref_node_xyz(ref_node, 2, new_node) = 0.0;
    } else {
      RSS(meshb_real(file, version, &(ref_node_xyz(ref_node, 0, new_node))),
          "x");
      RSS(meshb_real(file, version, &(ref_node_xyz(ref_node, 1, new_node))),
          "y");
      RSS(meshb_real(file, version, &(ref_node_xyz(ref_node, 2, new_node))),
          "z");
    }
    RSS(ref_import_meshb_int(file, version, &id), "nnode");
  }
  REIS(next_position, ftello(file), "end location");

  RSS(ref_node_initialize_n_global(ref_node, nnode), "init glob");

  each_ref_grid_all_ref_cell(ref_grid, group, ref_cell) {
    RSS(ref_cell_meshb_keyword(ref_cell, &keyword_code), "kw");
    RSS(ref_import_meshb_jump(file, version, key_pos, keyword_code, &available,
                              &next_position),
        "jump");
    if (available) {
      node_per = ref_cell_node_per(ref_cell);
      RSS(ref_import_meshb_int(file, version, &ncell), "ncell");
      if (verbose) printf(" group %d ncell %d\n", group, ncell);
      for (cell = 0; cell < ncell; cell++) {
        for (node = 0; node < (1 + node_per); node++) {
          RSS(ref_import_meshb_int(file, version, &(nodes[node])), "c2n");
        }
        for (node = 0; node < node_per; node++) {
          nodes[node]--;
        }
        if (REF_CELL_PYR == ref_cell_type(ref_cell)) {
          /* convention: square basis is 0-1-2-3
             (oriented counter clockwise like trias) and top vertex is 4 */
          n0 = nodes[0];
          n1 = nodes[1];
          n2 = nodes[2];
          n3 = nodes[3];
          n4 = nodes[4];
          nodes[0] = n0;
          nodes[3] = n1;
          nodes[4] = n2;
          nodes[1] = n3;
          nodes[2] = n4;
        }
        RSS(ref_cell_add(ref_cell, nodes, &new_cell), "add cell");
      }
      REIS(next_position, ftell(file), "cell inconsistent");
    }
  }

  each_ref_type(ref_geom, type) {
    geom_keyword = 40 + type;
    RSS(ref_import_meshb_jump(file, version, key_pos, geom_keyword, &available,
                              &next_position),
        "jump");
    if (available) {
      RSS(ref_import_meshb_int(file, version, &(ngeom)), "ngeom");
      if (verbose) printf("type %d ngeom %d\n", type, ngeom);

      for (geom = 0; geom < ngeom; geom++) {
        RSS(ref_import_meshb_int(file, version, &(node)), "node");
        RSS(ref_import_meshb_int(file, version, &(id)), "node");
        for (i = 0; i < type; i++)
          REIS(1, fread(&(param[i]), sizeof(double), 1, file), "param");
        node--;
        RSS(ref_geom_add(ref_geom, node, type, id, param), "add geom");
        if (0 < type) {
          double double_gref;
          REF_INT new_geom;
          REIS(1, fread(&(double_gref), sizeof(double), 1, file), "gref");
          RSS(ref_geom_find(ref_geom, node, type, id, &new_geom), "find");
          ref_geom_gref(ref_geom, new_geom) = (REF_INT)double_gref;
        }
      }
      REIS(next_position, ftello(file), "end location");
    }
  }

  cad_data_keyword = 126; /* GmfByteFlow */
  RSS(ref_import_meshb_jump(file, version, key_pos, cad_data_keyword,
                            &available, &next_position),
      "jump");
  if (available) {
    RSS(ref_import_meshb_size(file, version,
                              &(ref_geom_cad_data_size(ref_geom))),
        "cad data size");
    if (verbose)
      printf("cad_data %ld bytes\n", (long)ref_geom_cad_data_size(ref_geom));
    /* safe non-NULL free, if already allocated, to prevent memory leaks */
    ref_free(ref_geom_cad_data(ref_geom));
    ref_malloc_size_t(ref_geom_cad_data(ref_geom),
                      ref_geom_cad_data_size(ref_geom), REF_BYTE);
    REIS(ref_geom_cad_data_size(ref_geom),
         fread(ref_geom_cad_data(ref_geom), sizeof(REF_BYTE),
               ref_geom_cad_data_size(ref_geom), file),
         "cad_data");
    REIS(next_position, ftello(file), "end location");
  }

  fclose(file);

  return REF_SUCCESS;
}